

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::StringTrieBuilder::SplitBranchNode::markRightEdgesFirst
          (SplitBranchNode *this,int32_t edgeNumber)

{
  int iVar1;
  
  if ((this->super_BranchNode).super_Node.offset != 0) {
    return edgeNumber;
  }
  (this->super_BranchNode).firstEdgeNumber = edgeNumber;
  iVar1 = (*(this->greaterOrEqual->super_UObject)._vptr_UObject[4])(this->greaterOrEqual,edgeNumber)
  ;
  iVar1 = (*(this->lessThan->super_UObject)._vptr_UObject[4])(this->lessThan,(ulong)(iVar1 - 1));
  (this->super_BranchNode).super_Node.offset = iVar1;
  return iVar1;
}

Assistant:

int32_t
StringTrieBuilder::SplitBranchNode::markRightEdgesFirst(int32_t edgeNumber) {
    if(offset==0) {
        firstEdgeNumber=edgeNumber;
        edgeNumber=greaterOrEqual->markRightEdgesFirst(edgeNumber);
        offset=edgeNumber=lessThan->markRightEdgesFirst(edgeNumber-1);
    }
    return edgeNumber;
}